

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O2

void bt1(FX *startFX)

{
  int iVar1;
  bool bVar2;
  LispPTR LVar3;
  uint uVar4;
  LispPTR *pLVar5;
  int iVar6;
  
  BT_lines = 0;
  URaid_FXarray[0] = startFX;
  printf("%3d : ",0);
  pLVar5 = NativeAligned4FromLAddr(startFX->fnheader);
  LVar3 = LAddrFromNative(startFX);
  printf("   0x%x : ",(ulong)LVar3);
  print(pLVar5[2] & 0xfffffff);
  putchar(10);
  iVar6 = BT_lines + 1;
  bVar2 = 0x1d < BT_lines;
  BT_lines = iVar6;
  if (bVar2) {
    printf("Press Return(to quit Esc and Ret):");
    BT_temp = getchar();
    fflush(_stdin);
    BT_lines = 0;
    if (BT_temp == 0x1b) {
LAB_00112f05:
      BT_lines = 0;
      longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
    }
  }
  iVar6 = 1;
LAB_00112de1:
  if ((pLVar5[2] & 0xfffffff) != 0x4c) {
    if (startFX->alink != 0xb) {
      if (1999 < iVar6) {
        printf("***There are more than %d stack frames.\n");
        puts(
            "If you want to continue, Uraid will smash its internal table for FX pointer. Do you accept?(Y or N)"
            );
        uVar4 = getchar();
        fflush(_stdin);
        if ((uVar4 & 0xffffffdf) != 0x59) goto LAB_00112f74;
        iVar6 = 0;
        memset(URaid_FXarray,0,8000);
      }
      startFX = get_nextFX(startFX);
      pLVar5 = NativeAligned4FromLAddr(startFX->fnheader);
      URaid_FXarray[iVar6] = startFX;
      iVar6 = iVar6 + 1;
      printf("%3d : ");
      LVar3 = LAddrFromNative(startFX);
      printf("   0x%x : ",(ulong)LVar3);
      print(pLVar5[2] & 0xfffffff);
      putchar(10);
      iVar1 = BT_lines + 1;
      bVar2 = BT_lines < 0x1e;
      BT_lines = iVar1;
      if (bVar2) goto LAB_00112de1;
      printf("Press Return(to quit Esc and Ret):");
      BT_temp = getchar();
      fflush(_stdin);
      BT_lines = 0;
      if (BT_temp == 0x1b) goto LAB_00112f05;
      goto LAB_00112de1;
    }
    puts(">>root frame for contextsw<<");
    putchar(10);
    iVar1 = BT_lines + 1;
    bVar2 = 0x1d < BT_lines;
    BT_lines = iVar1;
    if (bVar2) {
      printf("Press Return(to quit Esc and Ret):");
      BT_temp = getchar();
      fflush(_stdin);
      BT_lines = 0;
      if (BT_temp != 0x1b) goto LAB_00112f74;
      goto LAB_00112f05;
    }
  }
LAB_00112f74:
  URaid_ArrMAXIndex = iVar6 + -1;
  URaid_currentFX = 0;
  return;
}

Assistant:

void bt1(FX *startFX) {
  FX *fx;
  struct fnhead *fnobj;
  FX *get_nextFX(FX * fx);
  int fnum = 0;
  BT_lines = 0;
  fx = startFX;
  URaid_FXarray[fnum] = fx;
  printf("%3d : ", fnum++);
#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
  printf("   0x%x : ", LAddrFromNative(fx));
  print(fnobj->framename);
  putchar('\n');
  BT_morep;
  while ((fnobj->framename != ATOM_T) && (fx->alink != 11)) {
    if (fnum > URMAXFXNUM - 1) {
      /* Internal buf overflow, too many stack frames */
      printf("***There are more than %d stack frames.\n", URMAXFXNUM);
      printf(
          "If you want to continue, Uraid will smash its internal table for FX pointer. Do you "
          "accept?(Y or N)\n");
      {
        int c;
        c = getchar();
        fflush(stdin);
        if ((c == 'Y') || (c == 'y')) {
          fnum = 0;
          memset(URaid_FXarray, 0, URMAXFXNUM * 4);
        } else
          goto bt1_exit;
      }
    }

    fx = get_nextFX(fx);
#ifdef BIGVM
    fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
    fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
    URaid_FXarray[fnum] = fx;
    printf("%3d : ", fnum++);
    printf("   0x%x : ", LAddrFromNative(fx));
    print(fnobj->framename);
    putchar('\n');
    BT_morep;
  }
  if (fnobj->framename != ATOM_T) {
    printf(">>root frame for contextsw<<\n");
    putchar('\n');
    BT_morep;
  }

bt1_exit:
  URaid_ArrMAXIndex = fnum - 1;
  URaid_currentFX = 0;
}